

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_herb(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  undefined2 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  CHAR_DATA *ch_00;
  char *txt;
  long lVar6;
  AFFECT_DATA af;
  char arg [4608];
  
  one_argument(argument,arg);
  iVar4 = get_skill(ch,(int)gsn_herb);
  if (iVar4 != 0) {
    sVar1 = ch->level;
    lVar6 = (long)gsn_herb;
    this = char_data::Class(ch);
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar6 * 0x60 + 0x4ab788 + (long)iVar4 * 2) <= sVar1) {
      bVar3 = is_affected(ch,(int)gsn_herb);
      if (bVar3) {
        txt = "You can\'t find any more herbs.\n\r";
      }
      else {
        uVar2 = ch->in_room->sector_type;
        if ((ushort)(uVar2 - 3) < 3) {
          ch_00 = ch;
          if ((arg[0] == '\0') || (ch_00 = get_char_room(ch,arg), ch_00 != (CHAR_DATA *)0x0)) {
            iVar4 = number_percent();
            iVar5 = get_skill(ch,(int)gsn_herb);
            if (iVar5 < iVar4) {
              send_to_char("You search for herbs but fail to find any.\n\r",ch);
              act("$n looks about in the bushes but finds nothing.",ch,(void *)0x0,(void *)0x0,0);
              check_improve(ch,(int)gsn_herb,false,4);
              return;
            }
            if (ch_00 == ch) {
              act("$n applies herbs to $mself.",ch,(void *)0x0,(void *)0x0,0);
              send_to_char("You find herbs and apply them to yourself.\n\r",ch);
            }
            else {
              act("$n applies herbs to $N.",ch,(void *)0x0,ch_00,1);
              act("You apply herbs to $N.",ch,(void *)0x0,ch_00,3);
              act("$n applies herbs to you.",ch,(void *)0x0,ch_00,2);
            }
            send_to_char("You feel better.\n\r",ch_00);
            bVar3 = is_affected_by(ch_00,0x17);
            if ((bVar3) && (iVar4 = number_percent(), 0x1e < iVar4)) {
              switchD_00333f01::default(ch_00,(int)gsn_plague);
              act("The sores on $n\'s body vanish.\n\r",ch_00,(void *)0x0,(void *)0x0,0);
              send_to_char("The sores on your body vanish.\n\r",ch_00);
            }
            check_improve(ch,(int)gsn_herb,true,4);
            iVar4 = ch->level * 4 + ch_00->hit;
            if (ch_00->max_hit <= iVar4) {
              iVar4 = (int)ch_00->max_hit;
            }
            ch_00->hit = iVar4;
            init_affect(&af);
            af.where = 0;
            af.type = gsn_herb;
            af.duration = 4;
            af.location = 0;
            af.modifier = 0;
            af.aftype = 1;
            af.level = ch->level;
            affect_to_char(ch,&af);
            return;
          }
          txt = "They aren\'t here.\n\r";
        }
        else {
          txt = "You can\'t find any herbs here.\n\r";
        }
      }
      goto LAB_002f172e;
    }
  }
  txt = "Huh?\n\r";
LAB_002f172e:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_herb(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	AFFECT_DATA af;

	one_argument(argument, arg);

	if (get_skill(ch, gsn_herb) == 0 || ch->level < skill_table[gsn_herb].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_herb))
	{
		send_to_char("You can't find any more herbs.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_FOREST
		&& ch->in_room->sector_type != SECT_HILLS
		&& ch->in_room->sector_type != SECT_MOUNTAIN)
	{
		send_to_char("You can't find any herbs here.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		victim = ch;
	}
	else
	{
		victim = get_char_room(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (number_percent() > get_skill(ch, gsn_herb))
	{
		send_to_char("You search for herbs but fail to find any.\n\r", ch);
		act("$n looks about in the bushes but finds nothing.", ch, 0, 0, TO_ROOM);
		check_improve(ch, gsn_herb, false, 4);
		return;
	}

	if (victim != ch)
	{
		act("$n applies herbs to $N.", ch, 0, victim, TO_NOTVICT);
		act("You apply herbs to $N.", ch, 0, victim, TO_CHAR);
		act("$n applies herbs to you.", ch, 0, victim, TO_VICT);
	}

	if (victim == ch)
	{
		act("$n applies herbs to $mself.", ch, 0, 0, TO_ROOM);
		send_to_char("You find herbs and apply them to yourself.\n\r", ch);
	}

	send_to_char("You feel better.\n\r", victim);

	if (is_affected_by(victim, AFF_PLAGUE) && number_percent() > 30)
	{
		affect_strip(victim, gsn_plague);
		act("The sores on $n's body vanish.\n\r", victim, 0, 0, TO_ROOM);
		send_to_char("The sores on your body vanish.\n\r", victim);
	}

	check_improve(ch, gsn_herb, true, 4);

	victim->hit = std::min(victim->hit + (4 * ch->level), (int)victim->max_hit);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_herb;
	af.location = 0;
	af.duration = 4;
	af.modifier = 0;
	af.aftype = AFT_SKILL;
	af.level = ch->level;
	affect_to_char(ch, &af);
}